

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

void split_path_file(char **dir,char **file,char *path)

{
  char *pcVar1;
  char local_32 [2];
  char *pcStack_30;
  char sep [2];
  char *next;
  char *slash;
  char *path_local;
  char **file_local;
  char **dir_local;
  
  local_32[0] = '/';
  local_32[1] = '\0';
  pcVar1 = path;
  do {
    next = pcVar1;
    pcStack_30 = strpbrk(next + 1,local_32);
    pcVar1 = pcStack_30;
  } while (pcStack_30 != (char *)0x0);
  if (path != next) {
    next = next + 1;
  }
  if (dir != (char **)0x0) {
    pcVar1 = my_strndup(path,(long)next - (long)path);
    *dir = pcVar1;
  }
  if (file != (char **)0x0) {
    pcVar1 = my_strdup(next);
    *file = pcVar1;
  }
  return;
}

Assistant:

void split_path_file(char ** dir, char ** file, const char * path) {
	const char * slash = path, * next;

#if defined(__WIN32)
	const char sep[] = "\\/";	// Windows allows either variant
#else
	const char sep[] = "/";
#endif

	while ((next = strpbrk(slash + 1, sep))) {
		slash = next;
	}

	if (path != slash) {
		slash++;
	}

	if (dir) {
		*dir = my_strndup(path, slash - path);
	}

	if (file) {
		*file = my_strdup(slash);
	}
}